

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedPGTrackData::extractData(ParsedPGTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  int iVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint8_t *puVar5;
  ulong __n;
  uint8_t *puVar6;
  
  puVar6 = buff + (long)size + -3;
  puVar5 = buff;
  iVar1 = size;
  do {
    iVar4 = iVar1;
    if (puVar6 < puVar5) break;
    uVar2 = AV_RB16(puVar5 + 1);
    puVar5 = puVar5 + (ushort)(uVar2 + 3);
    iVar1 = iVar4 + 10;
  } while ((uint16_t)(uVar2 + 3) != 0);
  if (puVar5 == buff + size) {
    pkt->size = iVar4;
    puVar5 = (uint8_t *)operator_new__((long)iVar4);
    pkt->data = puVar5;
    for (; buff <= puVar6; buff = buff + __n) {
      uVar2 = AV_RB16(buff + 1);
      puVar5[0] = 'P';
      puVar5[1] = 'G';
      uVar3 = my_ntohl((uint32_t)(pkt->pts / 0xe5b0));
      *(uint32_t *)(puVar5 + 2) = uVar3;
      puVar5[6] = '\0';
      puVar5[7] = '\0';
      puVar5[8] = '\0';
      puVar5[9] = '\0';
      __n = (ulong)(ushort)(uVar2 + 3);
      memcpy(puVar5 + 10,buff,__n);
      puVar5 = puVar5 + __n + 10;
    }
    if (puVar5 != pkt->data + pkt->size) {
      __assert_fail("dst == pkt->data + pkt->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                    ,0x1b1,
                    "virtual void ParsedPGTrackData::extractData(AVPacket *, uint8_t *, const int)")
      ;
    }
  }
  else {
    pkt->size = 0;
    pkt->data = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void ParsedPGTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    static constexpr int PG_HEADER_SIZE = 10;

    const uint8_t* curPtr = buff;
    const uint8_t* end = buff + size;
    int blocks = 0;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;
        if (blockSize == 0)
            break;
        curPtr += blockSize;
        blocks++;
    }
    // assert(curPtr == end);
    if (curPtr != end)
    {
        pkt->size = 0;
        pkt->data = nullptr;
        return;  // ignore invalid packet
    }

    pkt->size = size + PG_HEADER_SIZE * blocks;
    pkt->data = new uint8_t[pkt->size];
    curPtr = buff;
    uint8_t* dst = pkt->data;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;

        dst[0] = 'P';
        dst[1] = 'G';
        const auto ptsDts = reinterpret_cast<uint32_t*>(dst + 2);
        ptsDts[0] = my_htonl(static_cast<uint32_t>(internalClockToPts(pkt->pts)));
        ptsDts[1] = 0;
        dst += PG_HEADER_SIZE;
        memcpy(dst, curPtr, blockSize);
        curPtr += blockSize;
        dst += blockSize;
    }
    assert(dst == pkt->data + pkt->size);
}